

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapS.c
# Opt level: O0

void Fxu_HeapSingleCheckOne(Fxu_HeapSingle *p,Fxu_Single *pSingle)

{
  int Weight2;
  int Weight1;
  Fxu_Single *pSingle_local;
  Fxu_HeapSingle *p_local;
  
  if ((pSingle->HNum * 2 <= p->nItems) && (pSingle->Weight < p->pTree[pSingle->HNum << 1]->Weight))
  {
    __assert_fail("Weight1 >= Weight2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuHeapS.c"
                  ,0xb7,"void Fxu_HeapSingleCheckOne(Fxu_HeapSingle *, Fxu_Single *)");
  }
  if ((pSingle->HNum * 2 + 1 <= p->nItems) &&
     (pSingle->Weight < p->pTree[pSingle->HNum * 2 + 1]->Weight)) {
    __assert_fail("Weight1 >= Weight2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuHeapS.c"
                  ,0xbd,"void Fxu_HeapSingleCheckOne(Fxu_HeapSingle *, Fxu_Single *)");
  }
  return;
}

Assistant:

void Fxu_HeapSingleCheckOne( Fxu_HeapSingle * p, Fxu_Single * pSingle )
{
    int Weight1, Weight2;
    if ( FXU_HEAP_SINGLE_CHILD1_EXISTS(p,pSingle) )
    {
        Weight1 = FXU_HEAP_SINGLE_WEIGHT(pSingle);
        Weight2 = FXU_HEAP_SINGLE_WEIGHT( FXU_HEAP_SINGLE_CHILD1(p,pSingle) );
        assert( Weight1 >= Weight2 );
    }
    if ( FXU_HEAP_SINGLE_CHILD2_EXISTS(p,pSingle) )
    {
        Weight1 = FXU_HEAP_SINGLE_WEIGHT(pSingle);
        Weight2 = FXU_HEAP_SINGLE_WEIGHT( FXU_HEAP_SINGLE_CHILD2(p,pSingle) );
        assert( Weight1 >= Weight2 );
    }
}